

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test>
             *this)

{
  RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test *this_00;
  long in_RDI;
  Test *local_28;
  
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int>_>::SetParam
            ((ParamType *)(in_RDI + 8));
  this_00 = (RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test *)operator_new(0x630);
  anon_unknown.dwarf_22ecb::RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test::
  RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test(this_00);
  local_28 = (Test *)0x0;
  if (this_00 != (RcExternMethodsInterfaceTest_UpdateRateControllerTest_Test *)0x0) {
    local_28 = (Test *)&(this_00->super_RcExternMethodsInterfaceTest).super_CodecTestWithParam<int>;
  }
  return local_28;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }